

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hpp
# Opt level: O0

List<Variant> * __thiscall Variant::toList(Variant *this)

{
  int iVar1;
  Variant *this_local;
  
  if (this->data->type == listType) {
    this_local = (Variant *)(this->data + 1);
  }
  else {
    if (toList()::list == '\0') {
      iVar1 = __cxa_guard_acquire(&toList()::list);
      if (iVar1 != 0) {
        List<Variant>::List(&toList::list);
        __cxa_atexit(List<Variant>::~List,&toList::list,&__dso_handle);
        __cxa_guard_release(&toList()::list);
      }
    }
    this_local = (Variant *)&toList::list;
  }
  return (List<Variant> *)this_local;
}

Assistant:

const List<Variant>& toList() const
  {
    if(data->type == listType)
      return *(const List<Variant>*)(data + 1);
    static const List<Variant> list;
    return list;
  }